

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

natwm_error map_insert(map *map,void *key,void *value)

{
  uint32_t hash;
  natwm_error nVar1;
  size_t sVar2;
  map_entry *local_30;
  map_entry *entry;
  
  if (key == (void *)0x0) {
    nVar1 = GENERIC_ERROR;
  }
  else {
    local_30 = (map_entry *)0x0;
    sVar2 = (*map->key_size_function)(key);
    hash = (*map->hash_function)(key,sVar2);
    nVar1 = entry_init(hash,key,value,&local_30);
    if (nVar1 == NO_ERROR) {
      nVar1 = map_insert_entry(map,local_30);
    }
  }
  return nVar1;
}

Assistant:

enum natwm_error map_insert(struct map *map, const void *key, void *value)
{
        if (key == NULL) {
                return GENERIC_ERROR;
        }

        struct map_entry *entry = NULL;
        size_t key_size = map->key_size_function(key);
        uint32_t hash = map->hash_function(key, key_size);
        enum natwm_error error = entry_init(hash, key, value, &entry);

        if (error != NO_ERROR) {
                return error;
        }

        return map_insert_entry(map, entry);
}